

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicRectMatrix.hpp
# Opt level: O3

void __thiscall
OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
          (DynamicRectMatrix<double> *this,uint nrow,uint ncol,double s)

{
  uint uVar1;
  uint uVar2;
  double **ppdVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  long lVar11;
  
  allocate(this,nrow,ncol);
  auVar6 = _DAT_00258a80;
  auVar5 = _DAT_00258a70;
  uVar1 = this->nrow_;
  if ((ulong)uVar1 != 0) {
    uVar2 = this->ncol_;
    ppdVar3 = this->data_;
    lVar11 = (ulong)uVar2 - 1;
    auVar9._8_4_ = (int)lVar11;
    auVar9._0_8_ = lVar11;
    auVar9._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar7 = 0;
    auVar9 = auVar9 ^ _DAT_00258a80;
    do {
      if (uVar2 != 0) {
        pdVar4 = ppdVar3[uVar7];
        uVar8 = 0;
        auVar10 = auVar5;
        do {
          auVar12 = auVar10 ^ auVar6;
          if ((bool)(~(auVar9._4_4_ < auVar12._4_4_ ||
                      auVar9._0_4_ < auVar12._0_4_ && auVar12._4_4_ == auVar9._4_4_) & 1)) {
            *(double *)((long)pdVar4 + uVar8) = s;
          }
          if (auVar12._12_4_ <= auVar9._12_4_ &&
              (auVar12._8_4_ <= auVar9._8_4_ || auVar12._12_4_ != auVar9._12_4_)) {
            *(double *)((long)pdVar4 + uVar8 + 8) = s;
          }
          lVar11 = auVar10._8_8_;
          auVar10._0_8_ = auVar10._0_8_ + 2;
          auVar10._8_8_ = lVar11 + 2;
          uVar8 = uVar8 + 0x10;
        } while (((ulong)uVar2 * 8 + 8 & 0xfffffffffffffff0) != uVar8);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar1);
  }
  return;
}

Assistant:

DynamicRectMatrix(unsigned int nrow, unsigned int ncol, Real s) {
      allocate(nrow, ncol);
      for (unsigned int i = 0; i < nrow_; i++)
        for (unsigned int j = 0; j < ncol_; j++)
          this->data_[i][j] = s;
    }